

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

void NULLC::CopyArray(NULLCAutoArray *dst,NULLCAutoArray src)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  NULLCAutoArray *dst_local;
  
  if (dst == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
  }
  else {
    dst->typeID = src.typeID;
    dst->len = src.len;
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
    pcVar2 = (char *)AllocObject(src.len * pEVar1->size,src.typeID);
    dst->ptr = pcVar2;
    if (src.len != 0) {
      pcVar2 = dst->ptr;
      pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                         ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),src.typeID);
      memcpy(pcVar2,src.ptr,(ulong)(src.len * pEVar1->size));
    }
  }
  return;
}

Assistant:

void NULLC::CopyArray(NULLCAutoArray* dst, NULLCAutoArray src)
{
	if(!dst)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	dst->typeID = src.typeID;
	dst->len = src.len;
	dst->ptr = (char*)NULLC::AllocObject(src.len * linker->exTypes[src.typeID].size, src.typeID);

	if(src.len)
		memcpy(dst->ptr, src.ptr, unsigned(src.len * linker->exTypes[src.typeID].size));
}